

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O0

void __thiscall TPZIntTetra3D::Point(TPZIntTetra3D *this,int ip,TPZVec<double> *pos,REAL *w)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this_00;
  REAL *in_RCX;
  int in_ESI;
  TPZIntRuleT3D *in_RDI;
  REAL RVar5;
  TPZIntRuleT3D *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  TPZIntRuleT3D *pTVar6;
  
  iVar3 = in_ESI;
  if ((((in_RDI->fLocationKsi).super_TPZVec<long_double>._vptr_TPZVec != (_func_int **)0x0) &&
      (-1 < in_ESI)) &&
     (pTVar6 = in_RDI, iVar1 = (**(code **)(*(long *)in_RDI + 0x18))(), in_ESI < iVar1)) {
    TPZIntRuleT3D::Loc(unaff_retaddr,(int)((ulong)pTVar6 >> 0x20),
                       (TPZVec<double> *)CONCAT44(iVar3,in_stack_fffffffffffffff0));
    RVar5 = TPZIntRuleT3D::W(in_RDI,in_ESI);
    *in_RCX = RVar5;
    return;
  }
  if ((in_RDI->fLocationKsi).super_TPZVec<long_double>._vptr_TPZVec == (_func_int **)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Null Pointer passed to method ");
    std::operator<<(poVar4,"TPZIntTetra3D::Point(..)\n");
  }
  iVar1 = iVar3;
  if ((-1 < iVar3) && (iVar2 = (**(code **)(*(long *)in_RDI + 0x18))(), iVar3 < iVar2)) {
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"ip = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,", Out of Range: 0 -> ");
  iVar3 = (**(code **)(*(long *)in_RDI + 0x18))();
  this_00 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZIntTetra3D::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
	if((fIntKsi) && ((ip >= 0) && (ip < NPoints()))) {
		fIntKsi->Loc(ip, pos);
		w = fIntKsi->W(ip);
		return;
	}
	if(!fIntKsi)
		PZError 	<< "Null Pointer passed to method " << "TPZIntTetra3D::Point(..)\n";
	if((ip < 0) || (ip >= NPoints()))
		PZError 	<< "ip = " << ip << ", Out of Range: 0 -> " << NPoints() << std::endl;
}